

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

void __thiscall wallet::SelectionResult::Merge(SelectionResult *this,SelectionResult *other)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_00000020;
  SelectionResult *in_stack_00000028;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  InsertInputs<std::set<std::shared_ptr<wallet::COutput>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>>
            (in_stack_00000028,in_stack_00000020);
  *(long *)(in_RDI + 0x30) = *(long *)(in_RSI + 0x30) + *(long *)(in_RDI + 0x30);
  *(bool *)(in_RDI + 0x39) =
       (*(byte *)(in_RDI + 0x39) & 1) != 0 || (*(byte *)(in_RSI + 0x39) & 1) != 0;
  if (*(char *)(in_RDI + 0x38) == '\x04') {
    *(undefined1 *)(in_RDI + 0x38) = *(undefined1 *)(in_RSI + 0x38);
  }
  *(int *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) + *(int *)(in_RSI + 0x60);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SelectionResult::Merge(const SelectionResult& other)
{
    // As it can fail, combine inputs first
    InsertInputs(other.m_selected_inputs);

    m_target += other.m_target;
    m_use_effective |= other.m_use_effective;
    if (m_algo == SelectionAlgorithm::MANUAL) {
        m_algo = other.m_algo;
    }

    m_weight += other.m_weight;
}